

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

bool __thiscall YAML::Stream::operator_cast_to_bool(Stream *this)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  reference pvVar5;
  size_type in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined1 local_9;
  
  bVar1 = std::ios::good();
  local_9 = true;
  if ((bVar1 & 1) == 0) {
    bVar2 = std::deque<char,_std::allocator<char>_>::empty
                      ((deque<char,_std::allocator<char>_> *)0xf2a69d);
    local_9 = false;
    if (!bVar2) {
      pvVar5 = std::deque<char,_std::allocator<char>_>::operator[]
                         ((deque<char,_std::allocator<char>_> *)
                          (CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0) &
                          0xffffffffffffff),in_stack_ffffffffffffffd8);
      iVar4 = (int)*pvVar5;
      cVar3 = eof();
      local_9 = iVar4 != cVar3;
    }
  }
  return local_9;
}

Assistant:

Stream::operator bool() const {
  return m_input.good() ||
         (!m_readahead.empty() && m_readahead[0] != Stream::eof());
}